

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTextureCubeArray(ShaderEvalContext *c,TexLookupParams *p)

{
  anon_unknown_0 local_50 [16];
  tcu local_40 [16];
  undefined8 local_30;
  undefined8 uStack_28;
  
  textureCubeArray(local_50,c,c->in[0].m_data[0],c->in[0].m_data[1],c->in[0].m_data[2],
                   c->in[0].m_data[3],p->lod);
  tcu::operator*(local_40,(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+((tcu *)&local_30,(Vector<float,_4> *)local_40,&p->bias);
  *(undefined8 *)(c->color).m_data = local_30;
  *(undefined8 *)((c->color).m_data + 2) = uStack_28;
  return;
}

Assistant:

static void		evalTextureCubeArray	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = textureCubeArray(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), c.in[0].w(), p.lod)*p.scale + p.bias; }